

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergeFrom
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  InternalMetadataWithArena *this_00;
  LogFinisher local_b5;
  uint32 cached_has_bits;
  byte local_a1;
  LogMessage local_a0;
  CodeGeneratorResponse_File *local_68;
  CodeGeneratorResponse_File *from_local;
  CodeGeneratorResponse_File *this_local;
  InternalMetadataWithArena *local_50;
  undefined4 local_44;
  HasBits<1UL> *local_40;
  InternalMetadataWithArena *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_a1 = 0;
  local_68 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x68e);
    local_a1 = 1;
    other = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_b5,other);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (CodeGeneratorResponse_File *)&local_68->_internal_metadata_;
  local_50 = this_00;
  local_38 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom(this_00,&local_28->unknown_fields);
  }
  local_40 = &local_68->_has_bits_;
  local_44 = 0;
  uVar1 = local_40->has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_name(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault(&this->name_,psVar2,(local_68->name_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      set_has_insertion_point(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->insertion_point_,psVar2,(local_68->insertion_point_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      set_has_content(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault(&this->content_,psVar2,(local_68->content_).ptr_);
    }
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeFrom(const CodeGeneratorResponse_File& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 7u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_insertion_point();
      insertion_point_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.insertion_point_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_content();
      content_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.content_);
    }
  }
}